

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITabControl::removeTabButNotChild(CGUITabControl *this,s32 idx)

{
  int *piVar1;
  pointer ppIVar2;
  IGUITab *pIVar3;
  long lVar4;
  int iVar5;
  pointer ppIVar6;
  pointer __src;
  
  if (idx < 0) {
    return;
  }
  ppIVar2 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3) <= idx)
  {
    return;
  }
  pIVar3 = ppIVar2[(uint)idx];
  lVar4 = *(long *)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + -0x18);
  piVar1 = (int *)((long)&(pIVar3->super_IGUIElement).Children + lVar4 + 8U);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)((long)&(pIVar3->super_IGUIElement).super_IEventReceiver + lVar4) + 8))();
  }
  ppIVar2 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar6 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  __src = ppIVar2 + (ulong)(uint)idx + 1;
  if (__src != ppIVar6) {
    memmove(ppIVar2 + (uint)idx,__src,(long)ppIVar6 - (long)__src);
    ppIVar6 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppIVar6 + -1;
  iVar5 = this->ActiveTabIndex;
  if (iVar5 <= idx) {
    if (iVar5 != idx) {
      return;
    }
    iVar5 = idx;
    if ((int)((ulong)((long)(ppIVar6 + -1) -
                     (long)(this->Tabs).m_data.
                           super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) != idx)
    goto LAB_00226640;
  }
  idx = iVar5 + -1;
  this->ActiveTabIndex = idx;
LAB_00226640:
  setVisibleTab(this,idx);
  return;
}

Assistant:

void CGUITabControl::removeTabButNotChild(s32 idx)
{
	if (idx < 0 || idx >= (s32)Tabs.size())
		return;

	Tabs[(u32)idx]->drop();
	Tabs.erase((u32)idx);

	if (idx < ActiveTabIndex) {
		--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	} else if (idx == ActiveTabIndex) {
		if ((u32)idx == Tabs.size())
			--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}
}